

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

void Curl_dynhds_reset(dynhds *dynhds)

{
  size_t i;
  ulong uVar1;
  
  if (dynhds->hds_len != 0) {
    uVar1 = 0;
    do {
      (*Curl_cfree)(dynhds->hds[uVar1]);
      dynhds->hds[uVar1] = (dynhds_entry *)0x0;
      uVar1 = uVar1 + 1;
    } while (uVar1 < dynhds->hds_len);
  }
  dynhds->strs_len = 0;
  dynhds->hds_len = 0;
  return;
}

Assistant:

void Curl_dynhds_reset(struct dynhds *dynhds)
{
  DEBUGASSERT(dynhds);
  if(dynhds->hds_len) {
    size_t i;
    DEBUGASSERT(dynhds->hds);
    for(i = 0; i < dynhds->hds_len; ++i) {
      entry_free(dynhds->hds[i]);
      dynhds->hds[i] = NULL;
    }
  }
  dynhds->hds_len = dynhds->strs_len = 0;
}